

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

size_t coins_tests::InsertCoinsMapEntry
                 (CCoinsMap *map,CoinsCachePair *sentinel,CAmount value,char flags)

{
  long lVar1;
  uint uVar2;
  pointer ppVar3;
  uint8_t flags_00;
  byte in_CL;
  long in_RDX;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  inserted;
  CCoinsCacheEntry entry;
  CoinsCachePair *in_stack_ffffffffffffff18;
  CoinsCachePair *in_stack_ffffffffffffff20;
  CCoinsCacheEntry *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *in_stack_ffffffffffffff38;
  size_t local_78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == -2) {
    if (in_CL != 0xff) {
      __assert_fail("flags == NO_ENTRY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x253,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    local_78 = 0;
  }
  else {
    if (in_CL == 0xff) {
      __assert_fail("flags != NO_ENTRY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x256,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    CCoinsCacheEntry::CCoinsCacheEntry((CCoinsCacheEntry *)in_stack_ffffffffffffff18);
    SetCoinsValue((CAmount)in_stack_ffffffffffffff18,(Coin *)0x50c7b8);
    pVar4 = std::
            unordered_map<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>>
            ::emplace<COutPoint_const&,CCoinsCacheEntry>
                      (in_stack_ffffffffffffff38,
                       (COutPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x25a,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
                         *)in_stack_ffffffffffffff18);
    flags_00 = (uint8_t)((ulong)&ppVar3->second >> 0x38);
    uVar2 = (uint)in_CL;
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator*((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
              in_stack_ffffffffffffff18);
    CCoinsCacheEntry::AddFlags
              ((CCoinsCacheEntry *)CONCAT44(uVar2,in_stack_ffffffffffffff30),flags_00,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_ffffffffffffff18);
    local_78 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff18);
    CCoinsCacheEntry::~CCoinsCacheEntry((CCoinsCacheEntry *)in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_78;
  }
  __stack_chk_fail();
}

Assistant:

static size_t InsertCoinsMapEntry(CCoinsMap& map, CoinsCachePair& sentinel, CAmount value, char flags)
{
    if (value == ABSENT) {
        assert(flags == NO_ENTRY);
        return 0;
    }
    assert(flags != NO_ENTRY);
    CCoinsCacheEntry entry;
    SetCoinsValue(value, entry.coin);
    auto inserted = map.emplace(OUTPOINT, std::move(entry));
    assert(inserted.second);
    inserted.first->second.AddFlags(flags, *inserted.first, sentinel);
    return inserted.first->second.coin.DynamicMemoryUsage();
}